

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::PatchGetRootValueForTypeOf<false,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,DynamicObject *object,PropertyId propertyId)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ScriptContext *requestContext;
  RecyclableObject *pRVar6;
  undefined1 local_a0 [8];
  PropertyValueInfo info;
  AutoCatchHandlerExists autoCatchHandlerExists;
  AutoCleanup autoCleanup;
  RecyclableObject *local_38;
  
  if ((((object->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) != TypeIds_GlobalObject)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1fbb,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  local_a0 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_a0,functionBody,inlineCache,inlineCacheIndex,true);
  local_38 = (RecyclableObject *)0x0;
  bVar3 = CacheOperators::TryGetProperty<true,true,true,false,true,false,true,false,false,false>
                    (object,true,&object->super_RecyclableObject,propertyId,&local_38,requestContext
                     ,(PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_a0);
  pRVar6 = local_38;
  if (!bVar3) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,InlineCachePhase);
    if ((bVar3) && (DAT_0145948a == '\x01')) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetRootValueForTypeOf",propertyId,requestContext,
                 &object->super_RecyclableObject);
    }
    local_38 = (RecyclableObject *)0x0;
    JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
              ((AutoCatchHandlerExists *)&info.inlineCacheIndex,requestContext,true);
    PatchGetRootValueForTypeOf<false,Js::InlineCache>(Js::FunctionBody*,Js::
    InlineCache*,unsigned_int,Js::DynamicObject*,int)::AutoCleanup::AutoCleanup(Js::ScriptContext__
              (&autoCatchHandlerExists.m_threadContext,requestContext);
    BVar4 = GetRootProperty(object,propertyId,&local_38,requestContext,(PropertyValueInfo *)local_a0
                           );
    pRVar6 = (RecyclableObject *)(ulong)(uint)propertyId;
    if ((BVar4 != 0) &&
       (pRVar6 = local_38,
       &((((requestContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
        )->super_RecyclableObject == local_38)) {
      JavascriptError::ThrowReferenceError(requestContext,-0x7ff5ec07,(PCWSTR)0x0);
    }
    PatchGetRootValueForTypeOf<false,_Js::InlineCache>::AutoCleanup::~AutoCleanup
              ((AutoCleanup *)&autoCatchHandlerExists.m_threadContext);
    JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
              ((AutoCatchHandlerExists *)&info.inlineCacheIndex);
    if (BVar4 == 0) {
      pJVar1 = (requestContext->super_ScriptContextBase).javascriptLibrary;
      if (&((pJVar1->undeclBlockVarSentinel).ptr)->super_RecyclableObject == local_38) {
        JavascriptError::ThrowReferenceError(requestContext,-0x7ff5ec07,(PCWSTR)0x0);
      }
      pRVar6 = (pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
  }
  return pRVar6;
}

Assistant:

Var JavascriptOperators::PatchGetRootValueForTypeOf(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject * object, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetRootValueForTypeOf);
        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value = nullptr;
        if (CacheOperators::TryGetProperty<true, true, true, false, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
            object, true, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetRootValueForTypeOf"), propertyId, scriptContext, object);
        }
#endif
        value = nullptr;
        BEGIN_TYPEOF_ERROR_HANDLER(scriptContext);
        AssertOrFailFast(VarIsCorrectType(static_cast<RecyclableObject*>(object)));
        if (JavascriptOperators::GetRootProperty(object, propertyId, &value, scriptContext, &info))
        {
            if (scriptContext->IsUndeclBlockVar(value))
            {
                JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
            }
            return value;
        }
        END_TYPEOF_ERROR_HANDLER(scriptContext, value);

        value = scriptContext->GetLibrary()->GetUndefined();
        return value;
        JIT_HELPER_END(Op_PatchGetRootValueForTypeOf);
    }